

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver1L1Q1P<double>
            (vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             *__return_storage_ptr__,
            vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
            *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *plPair,
            vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
            *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                   *lCPair)

{
  XprTypeNested pMVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  iterator iVar5;
  undefined1 auVar6 [16];
  SrcEvaluatorType srcEvaluator_2;
  double *pdVar7;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar8;
  ostream *poVar9;
  long lVar10;
  pointer pMVar11;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar12;
  XprTypeNested pMVar13;
  iterator iVar14;
  assign_op<double,_double> *func;
  variable_if_dynamic<long,__1> *dst;
  long lVar15;
  byte bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  PointerType pdVar27;
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  predTrans;
  Matrix<double,_6,_1,_0,_6,_1> L2;
  Matrix<double,_6,_1,_0,_6,_1> L1;
  Matrix<double,_4,_4,_0,_4,_4> TU;
  Matrix<double,_4,_4,_0,_4,_4> TF2;
  Matrix<double,_4,_4,_0,_4,_4> TF1;
  Matrix<double,_6,_6,_0,_6,_6> transLineV;
  Matrix<double,_6,_6,_0,_6,_6> transLineU;
  Matrix<double,_4,_4,_0,_4,_4> TV;
  double local_948;
  double dStack_900;
  SrcXprType local_8f0;
  Matrix<double,_4,_4,_0,_4,_4> *local_8e8;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_8e0;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  double local_868;
  double dStack_860;
  double local_858;
  double dStack_850;
  double local_848;
  double dStack_840;
  double local_838;
  double dStack_830;
  double local_828;
  double dStack_820;
  double local_818;
  double dStack_810;
  Scalar local_808;
  Scalar local_800;
  Scalar local_7f8;
  Scalar local_7f0;
  Scalar local_7e8;
  Scalar local_7e0;
  Scalar local_7d8;
  Scalar local_7d0;
  Scalar local_7c8;
  Scalar local_7c0;
  PointerType local_7b8;
  double local_7b0;
  Matrix<double,_3,_3,_0,_3,_3> local_7a8;
  double dStack_760;
  double local_758;
  double dStack_750;
  double local_748;
  double dStack_740;
  double local_738;
  double dStack_730;
  XprTypeNested local_728;
  assign_op<double,_double> *local_720;
  XprTypeNested local_718;
  undefined8 local_710;
  Matrix<double,_4,_4,_0,_4,_4> local_708;
  Matrix<double,_4,_4,_0,_4,_4> *local_688;
  Matrix<double,_4,_4,_0,_4,_4> *local_680;
  Matrix<double,_4,_4,_0,_4,_4> *local_678;
  undefined8 local_670;
  double local_668;
  double dStack_660;
  double local_658;
  double dStack_650;
  double local_648;
  double dStack_640;
  double local_638;
  double dStack_630;
  double local_628;
  double dStack_620;
  double local_618;
  double dStack_610;
  double local_608;
  double dStack_600;
  double local_5f8;
  double dStack_5f0;
  double local_5e8;
  double dStack_5e0;
  double local_5d8;
  double dStack_5d0;
  double local_5c8 [2];
  Matrix<double,_4,_4,_0,_4,_4> local_5b8;
  Matrix<double,_4,_4,_0,_4,_4> local_538;
  Matrix<double,_4,_4,_0,_4,_4> local_4b8;
  Matrix<double,_6,_6,_0,_6,_6> local_438;
  Matrix<double,_6,_6,_0,_6,_6> local_318;
  Matrix<double,_4,_4,_0,_4,_4> local_1f8;
  Matrix<double,_4,_4,_0,_4,_4> local_178;
  Matrix<double,_3,_1,_0,_3,_1> local_f8;
  Matrix<double,_3,_1,_0,_3,_1> local_d8;
  Matrix<double,_4,_1,_0,_4,_1> local_b8;
  Matrix<double,_4,_1,_0,_4,_1> local_98;
  Matrix<double,_4,_1,_0,_4,_1> local_78;
  Matrix<double,_4,_1,_0,_4,_1> local_58;
  
  bVar16 = 0;
  ppVar2 = (ptPair->
           super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((((ptPair->
        super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish == ppVar2) ||
      (ppVar3 = (lPair->
                super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,
      (lPair->
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == ppVar3)) ||
     (ppVar4 = (plPair->
               super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     (plPair->
     super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
     )._M_impl.super__Vector_impl_data._M_finish == ppVar4)) {
    poVar9 = std::operator<<((ostream *)&std::cerr,
                             "Solver 1L1Q1P requires at least 1 point, 1 plane, and 1 line pair!");
    std::endl<char,std::char_traits<char>>(poVar9);
    exit(-1);
  }
  local_858 = (ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
              .m_data.array[0];
  dStack_850 = (ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[1];
  local_868 = (ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
              .m_data.array[2];
  dStack_860 = (ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[3];
  local_838 = (ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[0];
  dStack_830 = (ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[1];
  local_848 = (ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[2];
  dStack_840 = (ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[3];
  local_818 = (ppVar4->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
              .m_data.array[0];
  dStack_810 = (ppVar4->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[1];
  local_828 = (ppVar4->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
              .m_data.array[2];
  dStack_820 = (ppVar4->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
               m_storage.m_data.array[3];
  dVar38 = (ppVar4->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[0];
  dVar18 = (ppVar4->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[1];
  dVar30 = (ppVar4->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[2];
  dVar32 = (ppVar4->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[3];
  auVar28 = *(undefined1 (*) [16])
             (ppVar3->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array;
  auVar20 = *(undefined1 (*) [16])
             ((ppVar3->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array + 2);
  auVar21 = *(undefined1 (*) [16])
             (ppVar3->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array;
  auVar33 = *(undefined1 (*) [16])
             ((ppVar3->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array + 2);
  auVar6 = *(undefined1 (*) [16])
            (ppVar3->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array;
  dVar19 = (ppVar3->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
           m_storage.m_data.array[2];
  dVar23 = (ppVar3->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
           m_storage.m_data.array[3];
  auVar22 = *(undefined1 (*) [16])
             (ppVar3->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array;
  dVar31 = (ppVar3->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
           m_storage.m_data.array[2];
  dVar34 = (ppVar3->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
           m_storage.m_data.array[3];
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar24._8_4_ = auVar20._8_4_;
  auVar24._0_8_ = auVar20._8_8_;
  auVar24._12_4_ = auVar20._12_4_;
  auVar24 = divpd(auVar28,auVar24);
  dVar17 = auVar20._0_8_ / auVar20._8_8_;
  auVar28._8_4_ = auVar33._8_4_;
  auVar28._0_8_ = auVar33._8_8_;
  auVar28._12_4_ = auVar33._12_4_;
  auVar28 = divpd(auVar21,auVar28);
  dVar29 = auVar33._0_8_ / auVar33._8_8_;
  dVar37 = auVar28._0_8_;
  dVar39 = auVar28._8_8_;
  dVar35 = auVar24._0_8_;
  dVar36 = auVar24._8_8_;
  local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       (double)local_898;
  local_898._8_4_ = SUB84(dVar39 - dVar36,0);
  local_898._0_8_ = dVar37 - dVar35;
  local_898._12_4_ = (int)((ulong)(dVar39 - dVar36) >> 0x20);
  local_888._8_8_ = dVar39 * dVar17 - dVar36 * dVar29;
  local_888._0_8_ = dVar29 - dVar17;
  local_878._8_8_ = dVar37 * dVar36 - dVar35 * dVar39;
  local_878._0_8_ = dVar29 * dVar35 - dVar17 * dVar37;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
       [1];
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
       [1];
  auVar20._0_8_ =
       Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                   *)&local_438,(scalar_sum_op<double,_double> *)&local_708,
                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                   *)&local_318);
  auVar25._8_8_ = dVar34;
  auVar25._0_8_ = dVar34;
  dVar31 = dVar31 / dVar34;
  auVar24 = divpd(auVar22,auVar25);
  auVar26._8_8_ = dVar23;
  auVar26._0_8_ = dVar23;
  auVar33 = divpd(auVar6,auVar26);
  dVar19 = dVar19 / dVar23;
  auVar20._8_8_ = 0;
  auVar28 = sqrtpd(auVar20,auVar20);
  auVar21._0_8_ = auVar28._0_8_;
  auVar21._8_8_ = auVar21._0_8_;
  local_898 = divpd(local_898,auVar21);
  local_888 = divpd(local_888,auVar21);
  local_878 = divpd(local_878,auVar21);
  dVar17 = auVar24._0_8_;
  dVar35 = auVar24._8_8_;
  dVar23 = auVar33._0_8_;
  dVar34 = auVar33._8_8_;
  local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       (double)local_8c8;
  local_8c8._8_8_ = dVar35 - dVar34;
  local_8c8._0_8_ = dVar17 - dVar23;
  local_8b8._8_8_ = dVar35 * dVar19 - dVar34 * dVar31;
  local_8b8._0_8_ = dVar31 - dVar19;
  local_8a8._8_8_ = dVar17 * dVar34 - dVar23 * dVar35;
  local_8a8._0_8_ = dVar31 * dVar23 - dVar19 * dVar17;
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
       [1];
  local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
       [1];
  auVar33._0_8_ =
       Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                   *)&local_438,(scalar_sum_op<double,_double> *)&local_708,
                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                   *)&local_318);
  auVar33._8_8_ = 0;
  auVar28 = sqrtpd(auVar33,auVar33);
  auVar22._0_8_ = auVar28._0_8_;
  auVar22._8_8_ = auVar22._0_8_;
  local_8c8 = divpd(local_8c8,auVar22);
  local_8b8 = divpd(local_8b8,auVar22);
  local_8a8 = divpd(local_8a8,auVar22);
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       local_858;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       dStack_850;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       local_868;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       dStack_860;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       local_838;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       dStack_830;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       local_848;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       dStack_840;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       local_818;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       dStack_810;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       local_828;
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       dStack_820;
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       dVar38;
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       dVar18;
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       dVar30;
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       dVar32;
  getPredefinedTransformations1L1Q1P<double>(&local_8e0,&local_58,&local_78,&local_98,&local_b8);
  lVar15 = 0x10;
  pMVar11 = local_8e0.
            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  pMVar12 = &local_178;
  for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar11 = (pointer)((long)pMVar11 + ((ulong)bVar16 * -2 + 1) * 8);
    pMVar12 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar12 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  local_8e0.
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_8e0.
       super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -2;
  pMVar1 = (XprTypeNested)(local_5c8 + 2);
  pMVar11 = local_8e0.
            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pMVar13 = pMVar1;
  for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar11 = (pointer)((long)pMVar11 + ((ulong)bVar16 * -2 + 1) * 8);
    pMVar13 = (XprTypeNested)((long)pMVar13 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  memset(&local_318,0,0x120);
  memset(&local_438,0,0x120);
  pdVar7 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array + 2;
  do {
    dVar19 = *(double *)((long)local_5c8 + lVar15 + 8);
    ((plain_array<double,_36,_0,_16> *)(pdVar7 + -2))->array[0] =
         *(double *)((long)local_5c8 + lVar15);
    pdVar7[-1] = dVar19;
    *pdVar7 = *(double *)((long)local_5c8 + lVar15 + 0x10);
    lVar15 = lVar15 + 0x20;
    pdVar7 = pdVar7 + 6;
  } while (lVar15 != 0x70);
  lVar10 = 8;
  pdVar7 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array + 0x16;
  do {
    pdVar7[-1] = *(double *)((long)local_5c8 + lVar10 + 8);
    dVar19 = *(double *)((long)local_5c8 + lVar10 + 0x18);
    *pdVar7 = *(double *)((long)local_5c8 + lVar10 + 0x10);
    pdVar7[1] = dVar19;
    pdVar7 = pdVar7 + 6;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x68);
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_5b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_5b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_5b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  getSkew<double>(&local_7a8,&local_d8);
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)(local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array + 3);
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
       0.0;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10]
       = 0.0;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       -1.0;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       1.48219693752374e-323;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       1.48219693752374e-323;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb]
       = 1.97626258336499e-323;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       1.48219693752374e-323;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (double)&local_7a8;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       (double)pMVar1;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       (double)pMVar1;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (double)&local_318;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&local_4b8,
             (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)&local_708,(assign_op<double,_double> *)&local_538,(type)0x0);
  lVar10 = 0x10;
  pdVar7 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array + 2;
  do {
    dVar19 = *(double *)
              ((long)local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array + lVar10 + 0x78);
    ((plain_array<double,_36,_0,_16> *)(pdVar7 + -2))->array[0] =
         *(double *)
          ((long)local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array + lVar10 + 0x70);
    pdVar7[-1] = dVar19;
    *pdVar7 = *(double *)
               ((long)local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array + lVar10);
    lVar10 = lVar10 + 0x20;
    pdVar7 = pdVar7 + 6;
  } while (lVar10 != 0x70);
  lVar10 = 8;
  pdVar7 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array + 0x16;
  do {
    pdVar7[-1] = *(double *)
                  ((long)local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array + lVar10 + 0x78);
    dVar19 = *(double *)
              ((long)local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array + lVar10 + 8);
    *pdVar7 = *(double *)
               ((long)local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array + lVar10);
    pdVar7[1] = dVar19;
    pdVar7 = pdVar7 + 6;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x68);
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_178.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  getSkew<double>(&local_7a8,&local_f8);
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)(local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array + 3);
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
       0.0;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10]
       = 0.0;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       -1.0;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       (double)&local_178;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       1.48219693752374e-323;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       1.48219693752374e-323;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb]
       = 1.97626258336499e-323;
  dst = (variable_if_dynamic<long,__1> *)&local_4b8;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       1.48219693752374e-323;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  func = (assign_op<double,_double> *)&local_538;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (double)&local_7a8;
  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [5];
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       (double)&local_438;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)dst,
             (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)&local_708,func,(type)0x0);
  dVar32 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[4];
  dVar30 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[3];
  dVar18 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[1];
  dVar38 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0];
  dVar19 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[1];
  local_828 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[6] * (double)local_898._8_8_;
  dStack_820 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[7] * (double)local_898._8_8_;
  local_838 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0xc] * (double)local_888._0_8_;
  dStack_830 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0xd] * (double)local_888._0_8_;
  local_848 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x12] * (double)local_888._8_8_;
  dStack_840 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x13] * (double)local_888._8_8_;
  local_858 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x18] * (double)local_878._0_8_;
  dStack_850 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x19] * (double)local_878._0_8_;
  local_868 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[8] * (double)local_898._8_8_;
  dStack_860 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[9] * (double)local_898._8_8_;
  local_5c8[0] = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                 m_data.array[0xe] * (double)local_888._0_8_;
  local_5c8[1] = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                 m_data.array[0xf] * (double)local_888._0_8_;
  local_5d8 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x14] * (double)local_888._8_8_;
  dStack_5d0 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x15] * (double)local_888._8_8_;
  local_5e8 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x1a] * (double)local_878._0_8_;
  dStack_5e0 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x1b] * (double)local_878._0_8_;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
       0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10]
       = 0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc]
       = 0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd]
       = 0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe]
       = 0.0;
  local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]
       = 0.0;
  local_5f8 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x20] * (double)local_878._8_8_;
  dStack_5f0 = local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x21] * (double)local_878._8_8_;
  auVar6._8_4_ = SUB84((double)local_888._8_8_ *
                       local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                       m_storage.m_data.array[0x17],0);
  auVar6._0_8_ = (double)local_888._8_8_ *
                 local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                 m_data.array[0x16];
  auVar6._12_4_ =
       (int)((ulong)((double)local_888._8_8_ *
                    local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x17]) >> 0x20);
  local_818 = (double)local_878._0_8_ *
              local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x1c];
  dStack_810 = (double)local_878._0_8_ *
               local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x1d];
  local_628 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[6] * (double)local_8c8._8_8_;
  dStack_620 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[7] * (double)local_8c8._8_8_;
  local_638 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0xc] * (double)local_8b8._0_8_;
  dStack_630 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0xd] * (double)local_8b8._0_8_;
  local_648 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x12] * (double)local_8b8._8_8_;
  dStack_640 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x13] * (double)local_8b8._8_8_;
  local_658 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x18] * (double)local_8a8._0_8_;
  dStack_650 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x19] * (double)local_8a8._0_8_;
  local_608 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x1e] * (double)local_8a8._8_8_;
  dStack_600 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x1f] * (double)local_8a8._8_8_;
  local_668 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[8] * (double)local_8c8._8_8_;
  dStack_660 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[9] * (double)local_8c8._8_8_;
  local_618 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x20] * (double)local_8a8._8_8_;
  dStack_610 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x21] * (double)local_8a8._8_8_;
  lVar10 = 0;
  do {
    (((BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense> *)&dst->m_value)
    ->super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>).
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
         (PointerType)0x3ff0000000000000;
    lVar10 = lVar10 + 0x20;
    dst = dst + 5;
  } while (lVar10 != 0x80);
  dStack_900 = auVar6._8_8_;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe]
       = 0.0;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]
       = 0.0;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc]
       = 0.0;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd]
       = 0.0;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10]
       = 0.0;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       0.0;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
       0.0;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       0.0;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       0.0;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       0.0;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       0.0;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       0.0;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       0.0;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       0.0;
  local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       0.0;
  lVar10 = 0;
  do {
    *(undefined8 *)func = 0x3ff0000000000000;
    lVar10 = lVar10 + 0x20;
    func = func + 0x28;
  } while (lVar10 != 0x80);
  dVar23 = dVar38 * (double)local_898._0_8_ + local_828 + local_838 + local_848 + local_858 +
           local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1e] * (double)local_878._8_8_;
  dVar31 = dVar18 * (double)local_898._0_8_ + dStack_820 + dStack_830 + dStack_840 + dStack_850 +
           local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1f] * (double)local_878._8_8_;
  dVar36 = dVar30 * (double)local_898._0_8_ + dStack_860 + local_5c8[1] + dStack_5d0 + dStack_5e0 +
           dStack_5f0;
  dVar37 = dVar32 * (double)local_898._0_8_ +
           (double)local_898._8_8_ *
           local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[10] +
           (double)local_888._0_8_ *
           local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x10] +
           (double)local_888._8_8_ *
           local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x16] + local_818 +
           (double)local_878._8_8_ *
           local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x22];
  dVar29 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0] * (double)local_8c8._0_8_ + local_628 + local_638 + local_648 + local_658 +
           local_608;
  dVar40 = dVar19 * (double)local_8c8._0_8_ + dStack_620 + dStack_630 + dStack_640 + dStack_650 +
           dStack_600;
  dVar34 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[3] * (double)local_8c8._0_8_ + dStack_660 +
           local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xf] * (double)local_8b8._0_8_ +
           local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x15] * (double)local_8b8._8_8_ +
           local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1b] * (double)local_8a8._0_8_ + dStack_610;
  dVar38 = local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[4] * (double)local_8c8._0_8_ +
           (double)local_8c8._8_8_ *
           local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[10] +
           (double)local_8b8._0_8_ *
           local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x10] +
           (double)local_8b8._8_8_ *
           local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x16] +
           (double)local_8a8._0_8_ *
           local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1c] +
           (double)local_8a8._8_8_ *
           local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x22];
  dVar18 = (local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[5] * (double)local_898._0_8_ +
            (double)local_898._8_8_ *
            local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xb] +
            (double)local_888._0_8_ *
            local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x11] + dStack_900 + dStack_810 +
           (double)local_878._8_8_ *
           local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x23]) *
           (local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[2] * (double)local_8c8._0_8_ + local_668 +
            local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xe] * (double)local_8b8._0_8_ +
            local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x14] * (double)local_8b8._8_8_ +
            local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1a] * (double)local_8a8._0_8_ + local_618);
  dVar30 = (local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[5] * (double)local_8c8._0_8_ +
            (double)local_8c8._8_8_ *
            local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0xb] +
            (double)local_8b8._0_8_ *
            local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x11] +
            (double)local_8b8._8_8_ *
            local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x17] +
            (double)local_8a8._0_8_ *
            local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[0x1d] +
           (double)local_8a8._8_8_ *
           local_438.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x23]) *
           (local_318.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array[2] * (double)local_898._0_8_ + local_868 + local_5c8[0] + local_5d8 + local_5e8 +
           local_5f8);
  dVar32 = dVar36 * dVar29;
  dVar35 = dVar31 * dVar38;
  dVar17 = dVar37 * dVar40;
  dVar19 = dVar23 * dVar34;
  dVar39 = ((((dVar30 - dVar32) - dVar35) - dVar17) - dVar19) + dVar18;
  dVar38 = dVar37 * -2.0 * dVar29 +
           (dVar36 + dVar36) * dVar40 + (dVar23 + dVar23) * dVar38 + dVar31 * -2.0 * dVar34;
  dVar18 = dVar38 * dVar38 + dVar39 * -4.0 * (dVar19 + dVar35 + dVar30 + dVar32 + dVar17 + dVar18);
  local_948 = SQRT(dVar18);
  dVar19 = local_948;
  if (dVar18 < 0.0) {
    dVar19 = sqrt(dVar18);
  }
  dVar19 = (-dVar38 - dVar19) / (dVar39 + dVar39);
  if (dVar18 < 0.0) {
    local_948 = sqrt(dVar18);
  }
  if (!NAN(dVar19)) {
    dVar18 = dVar19 * dVar19 + 1.0;
    pdVar27 = (PointerType)((1.0 - dVar19 * dVar19) / dVar18);
    local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
         = 0.0;
    local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
         = 4.94065645841247e-324;
    local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
         = 4.94065645841247e-324;
    local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = (dVar19 * -2.0) / dVar18;
    local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)&local_4b8;
    local_4b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)pdVar27;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_708,
                        (Scalar *)&local_7a8);
    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = 0.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                       (pCVar8,(Scalar *)&local_1f8);
    local_8f0.m_xpr = (XprTypeNested)0x0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                       (pCVar8,(Scalar *)&local_8f0);
    local_7b0 = (dVar19 + dVar19) / dVar18;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                       (pCVar8,&local_7b0);
    local_7b8 = pdVar27;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                       (pCVar8,(Scalar *)&local_7b8);
    local_7c0 = 0.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                       (pCVar8,&local_7c0);
    local_7c8 = 0.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                       (pCVar8,&local_7c8);
    local_7d0 = 0.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                       (pCVar8,&local_7d0);
    local_7d8 = 0.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                       (pCVar8,&local_7d8);
    local_7e0 = 1.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                       (pCVar8,&local_7e0);
    local_7e8 = 0.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                       (pCVar8,&local_7e8);
    local_7f0 = 0.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                       (pCVar8,&local_7f0);
    local_7f8 = 0.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                       (pCVar8,&local_7f8);
    local_800 = 0.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                       (pCVar8,&local_800);
    local_808 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar8,&local_808);
    if (((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[3])->m_storage).m_data.array +
         (long)local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[1] == 4) &&
       (local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[2] == 1.97626258336499e-323)) {
      local_8f0.m_xpr = &local_178;
      local_8e8 = &local_4b8;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(&local_708,&local_8f0,(assign_op<double,_double> *)&local_7a8);
      dVar19 = (local_948 - dVar38) / (dVar39 + dVar39);
      local_688 = local_8e8;
      local_678 = local_8e8;
      local_670 = 4;
      lVar10 = 0;
      do {
        dVar38 = *(double *)
                  ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar10);
        dVar18 = *(double *)
                  ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar10 + 8);
        dVar30 = *(double *)
                  ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar10 + 0x10);
        dVar32 = *(double *)
                  ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar10 + 0x18);
        *(double *)
         ((long)local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar10) =
             dVar32 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xc] +
             dVar30 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[8] +
             dVar18 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[4] +
             dVar38 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0];
        *(double *)
         ((long)local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar10 + 8) =
             dVar32 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xd] +
             dVar30 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[9] +
             dVar18 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[5] +
             dVar38 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[1];
        dVar38 = *(double *)
                  ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar10);
        dVar18 = *(double *)
                  ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar10 + 8);
        dVar30 = *(double *)
                  ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar10 + 0x10);
        dVar32 = *(double *)
                  ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                         m_storage.m_data.array + lVar10 + 0x18);
        *(double *)
         ((long)local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar10 + 0x10) =
             dVar32 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xe] +
             dVar30 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[10] +
             dVar18 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[6] +
             dVar38 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[2];
        *(double *)
         ((long)local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar10 + 0x18) =
             dVar32 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xf] +
             dVar30 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[0xb] +
             dVar18 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[7] +
             dVar38 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[3];
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x80);
      local_710 = 4;
      lVar10 = 0;
      do {
        dVar38 = *(double *)((long)local_5c8 + lVar10 + 0x10);
        dVar18 = *(double *)((long)local_5c8 + lVar10 + 0x18);
        dVar30 = *(double *)((long)local_5c8 + lVar10 + 0x20);
        dVar32 = *(double *)((long)local_5c8 + lVar10 + 0x28);
        *(double *)
         ((long)local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar10) =
             local_748 * dVar32 +
             local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] * dVar30 +
             local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] * dVar18 +
             local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] * dVar38;
        *(double *)
         ((long)local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar10 + 8) =
             dStack_740 * dVar32 +
             dStack_760 * dVar30 +
             local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] * dVar18 +
             local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] * dVar38;
        *(double *)
         ((long)local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar10 + 0x10) =
             dVar32 * local_738 +
             dVar30 * local_758 +
             dVar18 * local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[6] +
             dVar38 * local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2];
        *(double *)
         ((long)local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar10 + 0x18) =
             dVar32 * dStack_730 +
             dVar30 * dStack_750 +
             dVar18 * local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[7] +
             dVar38 * local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[3];
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0x80);
      iVar5._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_728 = pMVar1;
      local_720 = (assign_op<double,_double> *)&local_7a8;
      local_718 = pMVar1;
      local_680 = &local_708;
      if (iVar5._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
        ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>>
                  ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                    *)__return_storage_ptr__,iVar5,&local_1f8);
      }
      else {
        pMVar12 = &local_1f8;
        iVar14._M_current = iVar5._M_current;
        for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
          ((iVar14._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[0] =
               (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
          pMVar12 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar12 + ((ulong)bVar16 * -2 + 1) * 8);
          iVar14._M_current =
               (Matrix<double,_4,_4,_0,_4,_4> *)
               ((long)iVar14._M_current + ((ulong)bVar16 * -2 + 1) * 8);
        }
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      dVar38 = dVar19 * dVar19 + 1.0;
      pdVar27 = (PointerType)((1.0 - dVar19 * dVar19) / dVar38);
      local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = 0.0;
      local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = 4.94065645841247e-324;
      local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 4.94065645841247e-324;
      local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (dVar19 * -2.0) / dVar38;
      local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)&local_538;
      local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)pdVar27;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_708,
                          (Scalar *)&local_7a8);
      local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = 0.0;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar8,(Scalar *)&local_1f8);
      local_8f0.m_xpr = (XprTypeNested)0x0;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar8,(Scalar *)&local_8f0);
      local_7b0 = (dVar19 + dVar19) / dVar38;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar8,&local_7b0);
      local_7b8 = pdVar27;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar8,(Scalar *)&local_7b8);
      local_7c0 = 0.0;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar8,&local_7c0);
      local_7c8 = 0.0;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar8,&local_7c8);
      local_7d0 = 0.0;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar8,&local_7d0);
      local_7d8 = 0.0;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar8,&local_7d8);
      local_7e0 = 1.0;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar8,&local_7e0);
      local_7e8 = 0.0;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar8,&local_7e8);
      local_7f0 = 0.0;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar8,&local_7f0);
      local_7f8 = 0.0;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar8,&local_7f8);
      local_800 = 0.0;
      pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar8,&local_800);
      local_808 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar8,&local_808);
      if (((long)(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                  local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[3])->m_storage).m_data.array +
           (long)local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[1] == 4) &&
         (local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[2] == 1.97626258336499e-323)) {
        local_8f0.m_xpr = &local_178;
        local_8e8 = &local_538;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run(&local_708,&local_8f0,(assign_op<double,_double> *)&local_7a8);
        local_688 = local_8e8;
        local_678 = local_8e8;
        local_670 = 4;
        lVar10 = 0;
        do {
          dVar19 = *(double *)
                    ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
                           .m_storage.m_data.array + lVar10);
          dVar38 = *(double *)
                    ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
                           .m_storage.m_data.array + lVar10 + 8);
          dVar18 = *(double *)
                    ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
                           .m_storage.m_data.array + lVar10 + 0x10);
          dVar30 = *(double *)
                    ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
                           .m_storage.m_data.array + lVar10 + 0x18);
          *(double *)
           ((long)local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + lVar10) =
               dVar30 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xc] +
               dVar18 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[8] +
               dVar38 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[4] +
               dVar19 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0];
          *(double *)
           ((long)local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + lVar10 + 8) =
               dVar30 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xd] +
               dVar18 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[9] +
               dVar38 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[5] +
               dVar19 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[1];
          dVar19 = *(double *)
                    ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
                           .m_storage.m_data.array + lVar10);
          dVar38 = *(double *)
                    ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
                           .m_storage.m_data.array + lVar10 + 8);
          dVar18 = *(double *)
                    ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
                           .m_storage.m_data.array + lVar10 + 0x10);
          dVar30 = *(double *)
                    ((long)(local_8e8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
                           .m_storage.m_data.array + lVar10 + 0x18);
          *(double *)
           ((long)local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + lVar10 + 0x10) =
               dVar30 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xe] +
               dVar18 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[10] +
               dVar38 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[6] +
               dVar19 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[2];
          *(double *)
           ((long)local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + lVar10 + 0x18) =
               dVar30 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xf] +
               dVar18 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xb] +
               dVar38 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[7] +
               dVar19 * local_708.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[3];
          lVar10 = lVar10 + 0x20;
        } while (lVar10 != 0x80);
        local_710 = 4;
        lVar10 = 0;
        do {
          dVar19 = *(double *)((long)local_5c8 + lVar10 + 0x10);
          dVar38 = *(double *)((long)local_5c8 + lVar10 + 0x18);
          dVar18 = *(double *)((long)local_5c8 + lVar10 + 0x20);
          dVar30 = *(double *)((long)local_5c8 + lVar10 + 0x28);
          *(double *)
           ((long)local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar10) =
               local_748 * dVar30 +
               local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] * dVar18 +
               local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[4] * dVar38 +
               local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] * dVar19;
          *(double *)
           ((long)local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar10 + 8) =
               dStack_740 * dVar30 +
               dStack_760 * dVar18 +
               local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] * dVar38 +
               local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1] * dVar19;
          *(double *)
           ((long)local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar10 + 0x10) =
               dVar30 * local_738 +
               dVar18 * local_758 +
               dVar38 * local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[6] +
               dVar19 * local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[2];
          *(double *)
           ((long)local_1f8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar10 + 0x18) =
               dVar30 * dStack_730 +
               dVar18 * dStack_750 +
               dVar38 * local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[7] +
               dVar19 * local_7a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[3];
          lVar10 = lVar10 + 0x20;
        } while (lVar10 != 0x80);
        iVar5._M_current =
             (__return_storage_ptr__->
             super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_720 = (assign_op<double,_double> *)&local_7a8;
        local_680 = &local_708;
        if (iVar5._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_728 = pMVar1;
          local_718 = pMVar1;
          std::
          vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>::
          _M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>>
                    ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                      *)__return_storage_ptr__,iVar5,&local_1f8);
        }
        else {
          pMVar12 = &local_1f8;
          iVar14._M_current = iVar5._M_current;
          for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
            ((iVar14._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array[0] =
                 (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
                 m_data.array[0];
            pMVar12 = (Matrix<double,_4,_4,_0,_4,_4> *)
                      ((long)pMVar12 + ((ulong)bVar16 * -2 + 1) * 8);
            iVar14._M_current =
                 (Matrix<double,_4,_4,_0,_4,_4> *)
                 ((long)iVar14._M_current + ((ulong)bVar16 * -2 + 1) * 8);
          }
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          local_728 = pMVar1;
          local_718 = pMVar1;
        }
        goto LAB_00171f3c;
      }
    }
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 4>>::finished() [MatrixType = Eigen::Matrix<double, 4, 4>]"
                 );
  }
LAB_00171f3c:
  if (local_8e0.
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8e0.
                    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_8e0.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_8e0.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> solver1L1Q1P(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{
	// check input vectors size
	if(ptPair.size() < 1 || lPair.size() < 1 || plPair.size() < 1){
		std::cerr << "Solver 1L1Q1P requires at least 1 point, 1 plane, and 1 line pair!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec,4,1> P1,P1_B,Pi,Pi_B,Q1,Q2,R1_B,R2_B;
	P1 = ptPair[0].first; P1_B = ptPair[0].second;
	Pi = plPair[0].first; Pi_B = plPair[0].second;

	Q1 = lPair[0].first.first; Q2 = lPair[0].first.second;
	R1_B = lPair[0].second.first; R2_B = lPair[0].second.second;

	// initialize the transformation matrix
	vector<Matrix<floatPrec, 4,4>> out;

	Matrix<floatPrec, 3,1> tP1, tP2, tQ1, tQ2;
	tP1 = Q1.head(3) / Q1(3);
	tP2 = Q2.head(3) / Q2(3);
	tQ1 = R1_B.head(3) / R1_B(3);
	tQ2 = R2_B.head(3) / R2_B(3);

	// computing the plucker coordinates of the lines
	// starting from line 1
	Matrix<floatPrec, 3,1> D1 = tP2 - tP1;
	Matrix<floatPrec, 6,1> L1;
	L1.head(3) = D1;
	L1.tail(3) = tP2.cross(tP1);
	L1 /= L1.head(3).norm();
	// starting from line 2
	Matrix<floatPrec, 3,1> D2 = tQ2 - tQ1;
	Matrix<floatPrec, 6,1> L2;
	L2.head(3) = D2;
	L2.tail(3) = tQ2.cross(tQ1);
	L2 /= L2.head(3).norm();

	// compute predefined transformations
	vector<Matrix<floatPrec, 4,4>> predTrans = getPredefinedTransformations1L1Q1P<floatPrec>(P1, P1_B, Pi, Pi_B);

	Matrix<floatPrec, 4,4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4,4> TU = predTrans.back();
	predTrans.pop_back();

	// transform lines to predefined frames
	Matrix<floatPrec, 6,6> transLineU, transLineV;
	transLineU.setZero();
	transLineV.setZero();
	transLineU.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	transLineU.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	transLineV.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	transLineV.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);

	Matrix<floatPrec, 6,1> L1_2, L2_2;
	L1_2 = transLineU * L1;
	L2_2 = transLineV * L2;

	// compute rotation around Z axis
	// initialize two transformation solutions
	Matrix<floatPrec, 4,4> TF1, TF2;
	TF1.setIdentity(4,4);
	TF2.setIdentity(4,4);

	// compute polynomial coefficients
	floatPrec l11, l12, l13, l14, l15, l16, l21, l22, l23, l24, l25, l26;
	l11 = L1_2[0];
	l12 = L1_2[1];
	l13 = L1_2[2];
	l14 = L1_2[3];
	l15 = L1_2[4];
	l16 = L1_2[5];
	l21 = L2_2[0];
	l22 = L2_2[1];
	l23 = L2_2[2];
	l24 = L2_2[3];
	l25 = L2_2[4];
	l26 = L2_2[5];
	floatPrec a, b, c;
	a = l13 * l26 - l14 * l21 - l12 * l25 - l15 * l22 - l11 * l24 + l16 * l23;
	b = 2 * l11 * l25 - 2 * l12 * l24 + 2 * l14 * l22 - 2 * l15 * l21;
	c = l11 * l24 + l12 * l25 + l13 * l26 + l14 * l21 + l15 * l22 + l16 * l23;

	// apply quadratic formula
	floatPrec s1, s2;
	s1 = (-b - sqrt(b * b - 4 * a * c)) / (2 * a);
	s2 = (-b + sqrt(b * b - 4 * a * c)) / (2 * a);

	if(!isnan(s1)){
		TF1 << (1 - s1 * s1) / (1 + s1 * s1), -2 * s1 / (1 + s1 * s1), 0, 0,
			2 * s1 / (1 + s1 * s1), (1 - s1 * s1) / (1 + s1 * s1), 0, 0,
			0, 0, 1, 0,
			0, 0, 0, 1;
		out.push_back(TV.inverse() * TF1 * TU);
		TF2 << (1 - s2 * s2) / (1 + s2 * s2), -2 * s2 / (1 + s2 * s2), 0, 0,
			2 * s2 / (1 + s2 * s2), (1 - s2 * s2) / (1 + s2 * s2), 0, 0,
			0, 0, 1, 0,
			0, 0, 0, 1;
		out.push_back(TV.inverse() * TF2 * TU);


	}
	return out;
}